

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O0

int QGregorianCalendar::yearSharingWeekDays(QDate date)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  int lastTwo;
  int res;
  int year;
  QDate *in_stack_ffffffffffffffc0;
  int *local_38;
  int local_28;
  int local_24;
  int local_20;
  int local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QDate::year(in_stack_ffffffffffffffc0);
  if (iVar3 < 0x7b2) {
    local_20 = iVar3;
    if (iVar3 < 0) {
      local_20 = iVar3 + 1;
    }
    local_24 = 0x960 - (2000 - local_20) % 400;
  }
  else {
    local_28 = iVar3;
    if (0x95f < iVar3) {
      local_28 = (iVar3 + -2000) % 400 + 2000;
    }
    local_24 = local_28;
  }
  local_18 = local_24;
  if (local_24 != iVar3) {
    iVar4 = QDate::month(in_stack_ffffffffffffffc0);
    if ((local_24 % 100 == iVar4) ||
       (iVar4 = QDate::day(in_stack_ffffffffffffffc0), local_24 % 100 == iVar4)) {
      bVar2 = leapTest(iVar3);
      if (bVar2) {
        local_38 = yearSharingWeekDays::leaps;
      }
      else {
        local_38 = yearSharingWeekDays::usual;
      }
      iVar3 = yearStartWeekDay(0);
      local_18 = local_38[iVar3 + -1];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

int QGregorianCalendar::yearSharingWeekDays(QDate date)
{
    // Returns a post-epoch year, no later than 2400, that has the same pattern
    // of week-days (in the proleptic Gregorian calendar) as the year in which
    // the given date falls. This will be the year in question if it's in the
    // given range. Otherwise, the returned year's last two (decimal) digits
    // won't coincide with the month number or day-of-month of the given date.
    // For positive years, except when necessary to avoid such a clash, the
    // returned year's last two digits shall coincide with those of the original
    // year.

    // Needed when formatting dates using system APIs with limited year ranges
    // and possibly only a two-digit year. (The need to be able to safely
    // replace the two-digit form of the returned year with a suitable form of
    // the true year, when they don't coincide, is why the last two digits are
    // treated specially.)

    static_assert((400 * 365 + 97) % 7 == 0);
    // A full 400-year cycle of the Gregorian calendar has 97 + 400 * 365 days;
    // as 365 is one more than a multiple of seven and 497 is a multiple of
    // seven, that full cycle is a whole number of weeks. So adding a multiple
    // of four hundred years should get us a result that meets our needs.

    const int year = date.year();
    int res = (year < 1970
               ? 2400 - (2000 - (year < 0 ? year + 1 : year)) % 400
               : year > 2399 ? 2000 + (year - 2000) % 400 : year);
    Q_ASSERT(res > 0);
    if (res != year) {
        const int lastTwo = res % 100;
        if (lastTwo == date.month() || lastTwo == date.day()) {
            Q_ASSERT(lastTwo && !(lastTwo & ~31));
            // Last two digits of these years are all > 31:
            static constexpr int usual[] = { 2198, 2199, 2098, 2099, 2399, 2298, 2299 };
            static constexpr int leaps[] = { 2396, 2284, 2296, 2184, 2196, 2084, 2096 };
            // Indexing is: first day of year's day-of-week, Monday = 0, one less
            // than Qt's, as it's simpler to subtract one than to s/7/0/.
            res = (leapTest(year) ? leaps : usual)[yearStartWeekDay(year) - 1];
        }
        Q_ASSERT(QDate(res, 1, 1).dayOfWeek() == QDate(year, 1, 1).dayOfWeek());
        Q_ASSERT(QDate(res, 12, 31).dayOfWeek() == QDate(year, 12, 31).dayOfWeek());
    }
    Q_ASSERT(res >= 1970 && res <= 2400);
    return res;
}